

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::Statistics::initLevel(Statistics *this,uint32 level)

{
  bool bVar1;
  uint32 uVar2;
  SolverStats *this_00;
  PrgDepGraph *pPVar3;
  NonHcfStats *pNVar4;
  uint in_ESI;
  long in_RDI;
  
  if (*(uint *)(in_RDI + 0x88) < in_ESI) {
    bVar1 = incremental((Statistics *)0x12283d);
    if ((bVar1) && (*(long *)(in_RDI + 0x48) == 0)) {
      this_00 = (SolverStats *)operator_new(0x40);
      SolverStats::SolverStats(this_00);
      *(SolverStats **)(in_RDI + 0x48) = this_00;
    }
    *(uint *)(in_RDI + 0x88) = in_ESI;
  }
  pPVar3 = SingleOwnerPtr<Clasp::Asp::PrgDepGraph,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::Asp::PrgDepGraph,_Clasp::DeleteObject> *)0x1228bc);
  if (pPVar3 != (PrgDepGraph *)0x0) {
    SingleOwnerPtr<Clasp::Asp::PrgDepGraph,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Clasp::Asp::PrgDepGraph,_Clasp::DeleteObject> *)0x1228d7);
    uVar2 = Asp::PrgDepGraph::numNonHcfs((PrgDepGraph *)0x1228df);
    if ((uVar2 != 0) && (*(long *)(in_RDI + 0x80) == 0)) {
      pPVar3 = SingleOwnerPtr<Clasp::Asp::PrgDepGraph,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::Asp::PrgDepGraph,_Clasp::DeleteObject> *)0x122908);
      pNVar4 = Asp::PrgDepGraph::nonHcfStats(pPVar3);
      *(NonHcfStats **)(in_RDI + 0x80) = pNVar4;
    }
  }
  return;
}

Assistant:

void ClaspFacade::Statistics::initLevel(uint32 level) {
	if (level_ < level) {
		if (incremental() && !solvers_.multi) { solvers_.multi = new SolverStats(); }
		level_ = level;
	}
	if (self_->ctx.sccGraph.get() && self_->ctx.sccGraph->numNonHcfs() && !tester_) {
		tester_ = self_->ctx.sccGraph->nonHcfStats();
	}
}